

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

void nn_ws_handshake_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm **__s;
  int *piVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  nn_queue_item *pnVar8;
  size_t hashed_len;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  nn_fsm_fn p_Var12;
  nn_usock *self_00;
  nn_fsm *pnVar13;
  nn_fsm *pnVar14;
  undefined1 *puVar15;
  long lVar16;
  nn_fsm_fn len;
  undefined8 uVar17;
  undefined8 uVar18;
  nn_fsm **local_f0;
  char *pos;
  nn_fsm *local_c0;
  nn_fsm *local_b8;
  nn_fsm *local_b0;
  nn_fsm *local_a8;
  nn_fsm *local_a0;
  nn_fsm *local_98;
  nn_fsm *local_90;
  nn_fsm *local_88;
  nn_fsm *local_80;
  nn_fsm *local_78;
  nn_fsm *local_70;
  nn_fsm *local_68;
  nn_fsm *local_60;
  nn_iovec open_request;
  uint8_t rand_key [16];
  
  iVar2 = 0x169d00;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) {
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      pcVar11 = "Unexpected source";
      uVar17 = 0x1bc;
      goto LAB_0015c83a;
    }
    if (type == -2) {
      if (self[0x33].fn == (nn_fsm_fn)0x0) {
        if (self[0x33].shutdown_fn < (nn_fsm_fn)0x4) {
          nn_backtrace_print();
          pcVar11 = "handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN";
          uVar17 = 0x19d;
        }
        else {
          nn_timer_start((nn_timer *)&self[1].shutdown_fn,*(int *)&self[3].stopped.srcptr);
          iVar2 = *(int *)((long)&self[1].fn + 4);
          if (iVar2 == 2) {
            len = self[0x33].shutdown_fn;
            if (len < (nn_fsm_fn)0x1001) {
              *(undefined4 *)&self[1].fn = 2;
              self_00 = *(nn_usock **)&self[3].stopped.type;
              local_f0 = &self[4].owner;
              goto LAB_0015bee3;
            }
            nn_backtrace_print();
            pcVar11 = "handshaker->recv_len <= sizeof (handshaker->opening_hs)";
            uVar17 = 0x1ac;
          }
          else if (iVar2 == 1) {
            if (self[0x33].shutdown_fn < (nn_fsm_fn)0x201) {
              *(undefined4 *)&self[1].fn = 4;
              nn_random_generate(rand_key,0x10);
              hashed_len = 0x19;
              iVar2 = nn_base64_encode(rand_key,0x10,(char *)&pos,0x19);
              if (iVar2 < 0) {
                nn_backtrace_print();
                pcVar11 = "rc >=0";
                uVar17 = 0x4d7;
              }
              else {
                sVar6 = strlen((char *)&pos);
                if (sVar6 == 0x18) {
                  iVar2 = nn_ws_handshake_hash_key
                                    ((char *)&pos,0x18,(char *)&self[0x34].stopped.type,hashed_len);
                  if (iVar2 == 0x1c) {
                    lVar16 = -8;
                    while (lVar10 = lVar16, lVar10 + 0x10 != 0xa8) {
                      lVar16 = lVar10 + 0x10;
                      if (*(int *)((long)&NN_WS_HANDSHAKE_SP_MAP[0].ws_sp + lVar10 + 4) ==
                          *(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4)) {
                        __s = &self[4].owner;
                        uVar17._0_4_ = self[4].state;
                        uVar17._4_4_ = self[4].src;
                        sprintf((char *)__s,
                                "GET %s HTTP/1.1\r\nHost: %s\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Key: %s\r\nSec-WebSocket-Version: 13\r\nSec-WebSocket-Protocol: %s\r\n\r\n"
                                ,uVar17,self[4].srcptr,&pos,
                                *(undefined8 *)((long)&NN_WS_HANDSHAKE_SP_MAP[1].server + lVar10));
                        open_request.iov_len = strlen((char *)__s);
                        open_request.iov_base = __s;
                        nn_usock_send(*(nn_usock **)&self[3].stopped.type,&open_request,1);
                        return;
                      }
                    }
                    nn_backtrace_print();
                    pcVar11 = "i < NN_WS_HANDSHAKE_SP_MAP_LEN";
                    uVar17 = 0x4ed;
                  }
                  else {
                    nn_backtrace_print();
                    pcVar11 = "rc == NN_WS_HANDSHAKE_ACCEPT_KEY_LEN";
                    uVar17 = 0x4e2;
                  }
                }
                else {
                  nn_backtrace_print();
                  pcVar11 = "encoded_key_len == sizeof (encoded_key) - 1";
                  uVar17 = 0x4db;
                }
              }
            }
            else {
              nn_backtrace_print();
              pcVar11 = "handshaker->recv_len <= sizeof (handshaker->response)";
              uVar17 = 0x1a5;
            }
          }
          else {
            nn_backtrace_print();
            pcVar11 = "0";
            uVar17 = 0x1b3;
          }
        }
      }
      else {
        nn_backtrace_print();
        pcVar11 = "handshaker->recv_pos == 0";
        uVar17 = 0x19c;
      }
LAB_0015c46f:
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar11,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
              ,uVar17);
      goto LAB_0015c479;
    }
    nn_backtrace_print();
    uVar9 = (ulong)*(uint *)&self[1].fn;
    uVar17 = 0xfffffffffffffffe;
    uVar18 = 0x1b8;
    break;
  case 2:
    if (src == 2) {
      if (type == 1) {
LAB_0015be95:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 7;
        return;
      }
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 2;
      uVar18 = 0x221;
    }
    else {
      if (src != 1) {
        nn_backtrace_print();
        uVar9 = (ulong)*(uint *)&self[1].fn;
        pcVar11 = "Unexpected source";
        uVar17 = 0x225;
        goto LAB_0015c83a;
      }
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0015be95;
      if (type == 4) {
        local_f0 = &self[4].owner;
        pvVar5 = memchr(local_f0,0,0x1000);
        if (pvVar5 == (void *)0x0) {
          nn_backtrace_print();
          pcVar11 = "memchr (self->opening_hs, \'\\0\', sizeof (self->opening_hs))";
          uVar17 = 0x35e;
        }
        else {
          sVar6 = strlen((char *)local_f0);
          if (sVar6 < 0x1000) {
            pos = (char *)local_f0;
            pcVar11 = strstr((char *)local_f0,"\r\n\r\n");
            if (pcVar11 != (char *)0x0) {
              self[0x34].srcptr = (void *)0x0;
              self[0x34].owner = (nn_fsm *)0x0;
              self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
              self[0x34].state = 0;
              self[0x34].src = 0;
              self[0x33].stopped.item.next = (nn_queue_item *)0x0;
              self[0x34].fn = (nn_fsm_fn)0x0;
              self[0x33].stopped.srcptr = (void *)0x0;
              *(undefined8 *)&self[0x33].stopped.type = 0;
              self[0x33].stopped.fsm = (nn_fsm *)0x0;
              *(undefined8 *)&self[0x33].stopped.src = 0;
              self[0x33].owner = (nn_fsm *)0x0;
              self[0x33].ctx = (nn_ctx *)0x0;
              self[0x33].state = 0;
              self[0x33].src = 0;
              self[0x33].srcptr = (void *)0x0;
              self[0x35].stopped.fsm = (nn_fsm *)0x0;
              *(undefined8 *)&self[0x35].stopped.src = 0;
              *(undefined4 *)&self[0x35].stopped.item.next = 0xffffffff;
              iVar2 = nn_ws_match_token("GET ",&pos,0,iVar2);
              if (iVar2 == 0) goto LAB_0015c59c;
              uVar17 = 0;
              iVar2 = nn_ws_match_value(" ",&pos,0,0,(char **)&self[0x35].stopped,
                                        (size_t *)&self[0x35].stopped.src);
              if (((iVar2 == 0) ||
                  (iVar2 = nn_ws_match_token("HTTP/1.1",&pos,0,(int)uVar17), iVar2 == 0)) ||
                 (iVar2 = nn_ws_match_token("\r\n",&pos,0,(int)uVar17), iVar2 == 0))
              goto LAB_0015c59c;
              local_88 = (nn_fsm *)&self[0x33].stopped;
              local_98 = (nn_fsm *)&self[0x33].stopped.srcptr;
              local_b8 = (nn_fsm *)&self[0x34].shutdown_fn;
              local_a0 = (nn_fsm *)&self[0x34].srcptr;
              local_70 = (nn_fsm *)&self[0x33].ctx;
              local_90 = (nn_fsm *)&self[0x33].stopped.src;
              local_b0 = (nn_fsm *)&self[0x33].stopped.type;
              local_c0 = (nn_fsm *)&self[0x34].state;
              local_a8 = (nn_fsm *)&self[0x34].owner;
              local_78 = (nn_fsm *)&self[0x35].stopped.srcptr;
              local_80 = (nn_fsm *)&self[0x35].stopped.type;
LAB_0015bad7:
              iVar2 = (int)uVar17;
              if (*pos == '\0') {
LAB_0015c483:
                uVar4 = 3;
                lVar16._0_4_ = self[0x33].state;
                lVar16._4_4_ = self[0x33].src;
                if (((lVar16 == 0) || (pnVar13 = (nn_fsm *)local_98->fn, pnVar13 == (nn_fsm *)0x0))
                   || ((pnVar8 = self[0x33].stopped.item.next, pnVar8 == (nn_queue_item *)0x0 ||
                       (((nn_fsm *)local_88->fn == (nn_fsm *)0x0 ||
                        ((nn_fsm *)local_b8->fn == (nn_fsm *)0x0)))))) goto LAB_0015c596;
                iVar3 = nn_ws_validate_value("13",(char *)local_b8->fn,(size_t)local_c0->fn,iVar2);
                if (iVar3 == 0) {
                  uVar4 = 4;
                  goto LAB_0015c596;
                }
                iVar3 = nn_ws_validate_value("websocket",(char *)pnVar13,(size_t)local_b0->fn,iVar2)
                ;
                if ((iVar3 == 0) ||
                   (iVar2 = nn_ws_validate_value
                                      ("Upgrade",(char *)pnVar8,(size_t)self[0x34].fn,iVar2),
                   iVar2 == 0)) goto LAB_0015c596;
                pnVar13 = (nn_fsm *)local_a0->fn;
                if (pnVar13 != (nn_fsm *)0x0) {
                  pnVar14 = (nn_fsm *)local_a8->fn;
                  uVar4 = 7;
                  lVar16 = -0x10;
                  goto LAB_0015c548;
                }
                iVar2 = nn_pipebase_ispeer((nn_pipebase *)self[4].shutdown_fn,0x10);
                uVar4 = 6;
                if (iVar2 != 0) {
                  uVar4 = 0;
                }
                *(undefined4 *)&self[0x35].stopped.item.next = uVar4;
                goto LAB_0015c59c;
              }
              open_request.iov_base = (void *)0x0;
              rand_key[0] = '\0';
              rand_key[1] = '\0';
              rand_key[2] = '\0';
              rand_key[3] = '\0';
              rand_key[4] = '\0';
              rand_key[5] = '\0';
              rand_key[6] = '\0';
              rand_key[7] = '\0';
              iVar3 = nn_ws_match_token("Host:",&pos,1,iVar2);
              pnVar13 = (nn_fsm *)&self[0x33].state;
              pnVar14 = (nn_fsm *)&self[0x33].srcptr;
              if ((((iVar3 == 0) &&
                   (iVar3 = nn_ws_match_token("Origin:",&pos,1,iVar2),
                   pnVar13 = (nn_fsm *)&self[0x33].owner, pnVar14 = local_70, iVar3 == 0)) &&
                  (iVar3 = nn_ws_match_token("Sec-WebSocket-Key:",&pos,1,iVar2), pnVar13 = local_88,
                  pnVar14 = local_90, iVar3 == 0)) &&
                 (iVar3 = nn_ws_match_token("Upgrade:",&pos,1,iVar2), pnVar13 = local_98,
                 pnVar14 = local_b0, iVar3 == 0)) {
                iVar3 = nn_ws_match_token("Connection:",&pos,1,iVar2);
                if (iVar3 != 0) {
                  uVar17 = 1;
                  iVar2 = nn_ws_match_value("\r\n",&pos,1,1,(char **)&open_request,
                                            (size_t *)rand_key);
                  pnVar8 = (nn_queue_item *)nn_strcasestr((char *)open_request.iov_base,"upgrade");
                  self[0x33].stopped.item.next = pnVar8;
                  if (pnVar8 != (nn_queue_item *)0x0) {
                    self[0x34].fn = (nn_fsm_fn)0x7;
                  }
                  goto LAB_0015bbc6;
                }
                iVar3 = nn_ws_match_token("Sec-WebSocket-Version:",&pos,1,iVar2);
                pnVar13 = local_b8;
                pnVar14 = local_c0;
                if (((iVar3 == 0) &&
                    (iVar3 = nn_ws_match_token("Sec-WebSocket-Protocol:",&pos,1,iVar2),
                    pnVar13 = local_a0, pnVar14 = local_a8, iVar3 == 0)) &&
                   (iVar3 = nn_ws_match_token("Sec-WebSocket-Extensions:",&pos,1,iVar2),
                   pnVar13 = local_78, pnVar14 = local_80, iVar3 == 0)) {
                  iVar3 = nn_ws_match_token("\r\n",&pos,1,iVar2);
                  if (iVar3 == 0) {
                    pnVar13 = (nn_fsm *)0x0;
                    pnVar14 = (nn_fsm *)0x0;
                    goto LAB_0015bbbf;
                  }
                  if (*pos == '\0') goto LAB_0015c483;
                  nn_backtrace_print();
                  pcVar11 = "strlen (pos) == 0";
                  uVar17 = 0x3e0;
                  goto LAB_0015c46f;
                }
              }
LAB_0015bbbf:
              uVar17 = 1;
              iVar2 = nn_ws_match_value("\r\n",&pos,1,1,(char **)pnVar13,(size_t *)pnVar14);
LAB_0015bbc6:
              if (iVar2 == 0) goto LAB_0015c59c;
              goto LAB_0015bad7;
            }
            p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
            self[0x33].fn = p_Var12;
            if (p_Var12 < (nn_fsm_fn)0x1000) {
              if ((nn_fsm_fn)0x3 < p_Var12) {
                local_f0 = (nn_fsm **)((long)local_f0 + (long)p_Var12);
                puVar15 = (undefined1 *)((long)&self[4].srcptr + 4);
                for (lVar16 = 0; lVar16 != -4; lVar16 = lVar16 + -1) {
                  iVar2 = bcmp("\r\n\r\n",puVar15 + (long)p_Var12,lVar16 + 4U);
                  if (iVar2 == 0) {
                    if (3 < lVar16 + 4U) {
                      nn_backtrace_print();
                      pcVar11 = "i < NN_WS_HANDSHAKE_TERMSEQ_LEN";
                      uVar17 = 500;
                      goto LAB_0015c46f;
                    }
                    break;
                  }
                  puVar15 = puVar15 + 1;
                }
                len = (nn_fsm_fn)-lVar16;
                self[0x33].shutdown_fn = len;
                if (0x1000 < (ulong)((long)p_Var12 - lVar16)) {
                  *(undefined4 *)&self[0x35].stopped.item.next = 1;
                  *(undefined4 *)&self[1].fn = 3;
                  nn_ws_handshake_server_reply((nn_ws_handshake *)self);
                  return;
                }
                goto LAB_0015bfd8;
              }
              nn_backtrace_print();
              pcVar11 = "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN";
              uVar17 = 0x1e6;
            }
            else {
              nn_backtrace_print();
              pcVar11 = "handshaker->recv_pos < sizeof (handshaker->opening_hs)";
              uVar17 = 0x1de;
            }
          }
          else {
            nn_backtrace_print();
            pcVar11 = "strlen (self->opening_hs) < sizeof (self->opening_hs)";
            uVar17 = 0x362;
          }
        }
        goto LAB_0015c46f;
      }
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 1;
      uVar18 = 0x217;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 1) goto LAB_0015be95;
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 2;
      uVar18 = 0x247;
    }
    else {
      if (src != 1) {
        nn_backtrace_print();
        uVar9 = (ulong)*(uint *)&self[1].fn;
        pcVar11 = "Unexpected source";
        uVar17 = 0x24b;
        goto LAB_0015c83a;
      }
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0015be95;
      if (type == 3) {
LAB_0015bd36:
        nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
        *(undefined4 *)&self[1].fn = 8;
        return;
      }
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 1;
      uVar18 = 0x23d;
    }
    break;
  case 4:
    if (src == 2) {
      if (type == 1) goto LAB_0015be95;
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 2;
      uVar18 = 0x26d;
    }
    else {
      if (src != 1) {
        nn_backtrace_print();
        uVar9 = (ulong)*(uint *)&self[1].fn;
        pcVar11 = "Unexpected source";
        uVar17 = 0x271;
        goto LAB_0015c83a;
      }
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0015be95;
      if (type == 3) {
        *(undefined4 *)&self[1].fn = 5;
        self_00 = *(nn_usock **)&self[3].stopped.type;
        len = self[0x33].shutdown_fn;
        local_f0 = (nn_fsm **)((long)&self[0x35].stopped.item.next + 4);
        goto LAB_0015bee3;
      }
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 1;
      uVar18 = 0x263;
    }
    break;
  case 5:
    if (src == 2) {
      if (type == 1) goto LAB_0015be95;
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 2;
      uVar18 = 0x2d2;
    }
    else {
      if (src != 1) {
        nn_backtrace_print();
        uVar9 = (ulong)*(uint *)&self[1].fn;
        pcVar11 = "Unexpected source";
        uVar17 = 0x2d6;
        goto LAB_0015c83a;
      }
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0015be95;
      if (type == 4) {
        pcVar11 = (char *)((long)&self[0x35].stopped.item.next + 4);
        pvVar5 = memchr(pcVar11,0,0x200);
        if (pvVar5 == (void *)0x0) {
          nn_backtrace_print();
          pcVar11 = "memchr (self->response, \'\\0\', sizeof (self->response))";
          uVar17 = 0x43b;
        }
        else {
          sVar6 = strlen(pcVar11);
          if (sVar6 < 0x200) {
            pos = pcVar11;
            pcVar7 = strstr(pcVar11,"\r\n\r\n");
            if (pcVar7 != (char *)0x0) {
              *(undefined8 *)&self[0x34].stopped.src = 0;
              self[0x34].stopped.srcptr = (void *)0x0;
              self[0x34].ctx = (nn_ctx *)0x0;
              self[0x34].stopped.fsm = (nn_fsm *)0x0;
              self[0x34].srcptr = (void *)0x0;
              self[0x34].owner = (nn_fsm *)0x0;
              self[0x34].shutdown_fn = (nn_fsm_fn)0x0;
              self[0x34].state = 0;
              self[0x34].src = 0;
              self[0x33].stopped.item.next = (nn_queue_item *)0x0;
              self[0x34].fn = (nn_fsm_fn)0x0;
              self[0x33].stopped.srcptr = (void *)0x0;
              *(undefined8 *)&self[0x33].stopped.type = 0;
              self[0x35].state = 0;
              self[0x35].src = 0;
              self[0x35].srcptr = (void *)0x0;
              self[0x35].owner = (nn_fsm *)0x0;
              self[0x35].ctx = (nn_ctx *)0x0;
              iVar2 = nn_ws_match_token("HTTP/1.1 ",&pos,0,iVar2);
              if (iVar2 != 0) {
                local_88 = (nn_fsm *)&self[0x35].state;
                local_98 = (nn_fsm *)&self[0x35].srcptr;
                iVar2 = nn_ws_match_value(" ",&pos,0,0,(char **)local_88,(size_t *)local_98);
                if (iVar2 != 0) {
                  uVar17 = 0;
                  iVar2 = nn_ws_match_value("\r\n",&pos,0,0,(char **)&self[0x35].owner,
                                            (size_t *)&self[0x35].ctx);
                  if (iVar2 != 0) {
                    piVar1 = &self[0x34].stopped.src;
                    local_90 = (nn_fsm *)&self[0x33].stopped.srcptr;
                    local_b8 = (nn_fsm *)&self[0x33].stopped.item;
                    local_a0 = (nn_fsm *)&self[0x34].shutdown_fn;
                    local_78 = (nn_fsm *)&self[0x34].srcptr;
                    local_70 = (nn_fsm *)&self[0x34].stopped.srcptr;
                    local_b0 = (nn_fsm *)&self[0x33].stopped.type;
                    local_c0 = self + 0x34;
                    local_a8 = (nn_fsm *)&self[0x34].state;
                    local_80 = (nn_fsm *)&self[0x34].owner;
                    local_60 = (nn_fsm *)&self[0x35].stopped.srcptr;
                    local_68 = (nn_fsm *)&self[0x35].stopped.type;
                    do {
                      iVar2 = (int)uVar17;
                      if (*pos == '\0') {
LAB_0015c34e:
                        if (((((nn_fsm *)local_88->fn == (nn_fsm *)0x0) ||
                             (pnVar13 = (nn_fsm *)local_90->fn, pnVar13 == (nn_fsm *)0x0)) ||
                            ((pnVar14 = (nn_fsm *)local_b8->fn, pnVar14 == (nn_fsm *)0x0 ||
                             (((pcVar11 = *(char **)piVar1, pcVar11 == (char *)0x0 ||
                               (iVar3 = nn_ws_validate_value
                                                  ("101",(char *)local_88->fn,(size_t)local_98->fn,
                                                   iVar2), iVar3 == 0)) ||
                              (iVar3 = nn_ws_validate_value
                                                 ("websocket",(char *)pnVar13,(size_t)local_b0->fn,
                                                  iVar2), iVar3 == 0)))))) ||
                           ((iVar3 = nn_ws_validate_value
                                               ("Upgrade",(char *)pnVar14,(size_t)local_c0->fn,iVar2
                                               ), iVar3 == 0 ||
                            (iVar2 = nn_ws_validate_value
                                               ((char *)&self[0x34].stopped.type,pcVar11,
                                                (size_t)self[0x34].stopped.srcptr,iVar2), iVar2 == 0
                            )))) goto LAB_0015be95;
                        goto LAB_0015bd36;
                      }
                      iVar3 = nn_ws_match_token("Server:",&pos,1,iVar2);
                      pnVar13 = (nn_fsm *)&self[0x34].ctx;
                      pnVar14 = (nn_fsm *)&self[0x34].stopped;
                      if ((((((iVar3 == 0) &&
                             (iVar3 = nn_ws_match_token("Sec-WebSocket-Accept:",&pos,1,iVar2),
                             pnVar13 = (nn_fsm *)piVar1, pnVar14 = local_70, iVar3 == 0)) &&
                            (iVar3 = nn_ws_match_token("Upgrade:",&pos,1,iVar2), pnVar13 = local_90,
                            pnVar14 = local_b0, iVar3 == 0)) &&
                           ((iVar3 = nn_ws_match_token("Connection:",&pos,1,iVar2),
                            pnVar13 = local_b8, pnVar14 = local_c0, iVar3 == 0 &&
                            (iVar3 = nn_ws_match_token("Sec-WebSocket-Version-Server:",&pos,1,iVar2)
                            , pnVar13 = local_a0, pnVar14 = local_a8, iVar3 == 0)))) &&
                          (iVar3 = nn_ws_match_token("Sec-WebSocket-Protocol-Server:",&pos,1,iVar2),
                          pnVar13 = local_78, pnVar14 = local_80, iVar3 == 0)) &&
                         (iVar3 = nn_ws_match_token("Sec-WebSocket-Extensions:",&pos,1,iVar2),
                         pnVar13 = local_60, pnVar14 = local_68, iVar3 == 0)) {
                        iVar3 = nn_ws_match_token("\r\n",&pos,1,iVar2);
                        if (iVar3 != 0) {
                          if (*pos == '\0') goto LAB_0015c34e;
                          nn_backtrace_print();
                          pcVar11 = "strlen (pos) == 0";
                          uVar17 = 0x4a0;
                          goto LAB_0015c46f;
                        }
                        pnVar13 = (nn_fsm *)0x0;
                        pnVar14 = (nn_fsm *)0x0;
                      }
                      uVar17 = 1;
                      iVar2 = nn_ws_match_value("\r\n",&pos,1,1,(char **)pnVar13,(size_t *)pnVar14);
                    } while (iVar2 != 0);
                  }
                }
              }
            }
            p_Var12 = self[0x33].shutdown_fn + (long)self[0x33].fn;
            self[0x33].fn = p_Var12;
            if (p_Var12 < (nn_fsm_fn)0x200) {
              if ((nn_fsm_fn)0x3 < p_Var12) {
                local_f0 = (nn_fsm **)(pcVar11 + (long)p_Var12);
                pnVar8 = &self[0x35].stopped.item;
                for (lVar16 = 0; lVar16 != -4; lVar16 = lVar16 + -1) {
                  iVar2 = bcmp("\r\n\r\n",p_Var12 + (long)&pnVar8->next,lVar16 + 4U);
                  if (iVar2 == 0) {
                    if (3 < lVar16 + 4U) {
                      nn_backtrace_print();
                      pcVar11 = "i < NN_WS_HANDSHAKE_TERMSEQ_LEN";
                      uVar17 = 0x2a7;
                      goto LAB_0015c46f;
                    }
                    break;
                  }
                  pnVar8 = (nn_queue_item *)((long)&pnVar8->next + 1);
                }
                len = (nn_fsm_fn)-lVar16;
                self[0x33].shutdown_fn = len;
                if (0x200 < (ulong)((long)p_Var12 - lVar16)) goto LAB_0015be95;
LAB_0015bfd8:
                pnVar8 = &self[0x32].stopped.item;
                *(int *)&pnVar8->next = *(int *)&pnVar8->next + 1;
                self_00 = *(nn_usock **)&self[3].stopped.type;
LAB_0015bee3:
                nn_usock_recv(self_00,local_f0,(size_t)len,(int *)0x0);
                return;
              }
              nn_backtrace_print();
              pcVar11 = "handshaker->recv_pos >= (int) NN_WS_HANDSHAKE_TERMSEQ_LEN";
              uVar17 = 0x29c;
            }
            else {
              nn_backtrace_print();
              pcVar11 = "handshaker->recv_pos < sizeof (handshaker->response)";
              uVar17 = 0x294;
            }
          }
          else {
            nn_backtrace_print();
            pcVar11 = "strlen (self->response) < sizeof (self->response)";
            uVar17 = 0x43f;
          }
        }
        goto LAB_0015c46f;
      }
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 1;
      uVar18 = 0x2c8;
    }
    break;
  case 6:
    if (src == 2) {
      if (type == 1) goto LAB_0015be95;
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 2;
      uVar18 = 0x2f9;
    }
    else {
      if (src != 1) {
        nn_backtrace_print();
        uVar9 = (ulong)*(uint *)&self[1].fn;
        pcVar11 = "Unexpected source";
        uVar17 = 0x2fd;
        goto LAB_0015c83a;
      }
      if (type == 8) {
        return;
      }
      if (type == 5) goto LAB_0015be95;
      if (type == 3) goto LAB_0015bd36;
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      uVar17 = 1;
      uVar18 = 0x2ef;
    }
    break;
  case 7:
    if (src == 1) {
      return;
    }
    if (src != 2) {
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      pcVar11 = "Unexpected source";
      uVar17 = 0x316;
      goto LAB_0015c83a;
    }
    if (type == 2) {
      iVar2 = 2;
LAB_0015bd6a:
      nn_ws_handshake_leave((nn_ws_handshake *)self,iVar2);
      return;
    }
    nn_backtrace_print();
    uVar9 = (ulong)*(uint *)&self[1].fn;
    uVar17 = 2;
    uVar18 = 0x312;
    break;
  case 8:
    if (src == 1) {
      return;
    }
    if (src != 2) {
      nn_backtrace_print();
      uVar9 = (ulong)*(uint *)&self[1].fn;
      pcVar11 = "Unexpected source";
      uVar17 = 0x32f;
      goto LAB_0015c83a;
    }
    if (type == 2) {
      iVar2 = 1;
      goto LAB_0015bd6a;
    }
    nn_backtrace_print();
    uVar9 = (ulong)*(uint *)&self[1].fn;
    uVar17 = 2;
    uVar18 = 0x32b;
    break;
  case 9:
    nn_backtrace_print();
    uVar9 = (ulong)*(uint *)&self[1].fn;
    pcVar11 = "Unexpected source";
    uVar17 = 0x338;
    goto LAB_0015c83a;
  default:
    nn_backtrace_print();
    uVar9 = (ulong)*(uint *)&self[1].fn;
    pcVar11 = "Unexpected state";
    uVar17 = 0x33e;
LAB_0015c83a:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar11,uVar9,(ulong)(uint)src,
            (ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,uVar17);
    goto LAB_0015c479;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",uVar9,uVar17,
          (ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,uVar18);
LAB_0015c479:
  fflush(_stderr);
  nn_err_abort();
LAB_0015c596:
  *(undefined4 *)&self[0x35].stopped.item.next = uVar4;
  goto LAB_0015c59c;
  while (iVar2 = nn_ws_validate_value
                           (*(char **)((long)&NN_WS_HANDSHAKE_SP_MAP[1].ws_sp + lVar10),
                            (char *)pnVar13,(size_t)pnVar14,(int)lVar10), lVar16 = lVar10 + 0x10,
        iVar2 == 0) {
LAB_0015c548:
    lVar10 = lVar16;
    if (lVar10 + 0x10 == 0xa0) goto LAB_0015c596;
  }
  uVar4 = 6;
  if (*(int *)(*(long *)(*(long *)(self[4].shutdown_fn + 0x68) + 0x68) + 4) ==
      *(int *)((long)&NN_WS_HANDSHAKE_SP_MAP[1].server + lVar10)) {
    uVar4 = 0;
  }
  *(undefined4 *)&self[0x35].stopped.item.next = uVar4;
LAB_0015c59c:
  *(undefined4 *)&self[1].fn = 3;
  nn_ws_handshake_server_reply((nn_ws_handshake *)self);
  return;
}

Assistant:

static void nn_ws_handshake_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ws_handshake *handshaker;

    size_t i;

    handshaker = nn_cont (self, struct nn_ws_handshake, fsm);

    switch (handshaker->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_assert (handshaker->recv_pos == 0);
                nn_assert (handshaker->recv_len >= NN_WS_HANDSHAKE_TERMSEQ_LEN);

                nn_timer_start (&handshaker->timer, handshaker->timeout);

                switch (handshaker->mode) {
                case NN_WS_CLIENT:
                    /*  Send opening handshake to server. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->response));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_SEND;
                    nn_ws_handshake_client_request (handshaker);
                    return;
                case NN_WS_SERVER:
                    /*  Begin receiving opening handshake from client. */
                    nn_assert (handshaker->recv_len <=
                        sizeof (handshaker->opening_hs));
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_RECV;
                    nn_usock_recv (handshaker->usock, handshaker->opening_hs,
                        handshaker->recv_len, NULL);
                    return;
                default:
                    /*  Unexpected mode. */
                    nn_assert (0);
                    return;
                }

            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_client_opening (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Respond failure to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  Opening handshake parsed successfully, and is valid.
                        Respond success to client. */
                    handshaker->state = NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                    nn_ws_handshake_server_reply (handshaker);
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->opening_hs));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  We only compare if we have at least one byte to
                        compare against.  When i drops to zero, it means
                        we don't have any bytes to match against, and it is
                        automatically true. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->opening_hs + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the client. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->opening_hs)) {
                        handshaker->response_code =
                            NN_WS_HANDSHAKE_RESPONSE_TOO_BIG;
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_SERVER_REPLY;
                        nn_ws_handshake_server_reply (handshaker);
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->opening_hs + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  SERVER_REPLY state.                                                       */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_SERVER_REPLY:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_SEND state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_SEND:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                handshaker->state = NN_WS_HANDSHAKE_STATE_CLIENT_RECV;
                nn_usock_recv (handshaker->usock, handshaker->response,
                    handshaker->recv_len, NULL);
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  CLIENT_RECV state.                                                        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_CLIENT_RECV:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:
                /*  Parse bytes received thus far. */
                switch (nn_ws_handshake_parse_server_response (handshaker)) {
                case NN_WS_HANDSHAKE_INVALID:
                    /*  Opening handshake parsed successfully but does not
                        contain valid values. Fail connection. */
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    return;
                case NN_WS_HANDSHAKE_VALID:
                    /*  As per RFC 6455 4.2.2, the handshake is now complete
                        and the connection is immediately ready for send/recv. */
                    nn_timer_stop (&handshaker->timer);
                    handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                    return;
                case NN_WS_HANDSHAKE_RECV_MORE:
                    /*  Not enough bytes have been received to determine
                        validity; remain in the receive state, and retrieve
                        more bytes from client. */
                    handshaker->recv_pos += handshaker->recv_len;

                    /*  Validate the previous recv operation. */
                    nn_assert (handshaker->recv_pos <
                        sizeof (handshaker->response));

                    /*  Ensure we can back-track at least the length of the
                        termination sequence to determine how many bytes to
                        receive on the next retry. This is an assertion, not
                        a conditional, since under no condition is it
                        necessary to initially receive so few bytes. */
                    nn_assert (handshaker->recv_pos >=
                        (int) NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    /*  If i goes to 0, it no need to compare. */
                    for (i = NN_WS_HANDSHAKE_TERMSEQ_LEN; i > 0; i--) {
                        if (memcmp (NN_WS_HANDSHAKE_TERMSEQ,
                            handshaker->response + handshaker->recv_pos - i,
                            i) == 0) {
                            break;
                        }
                    }

                    nn_assert (i < NN_WS_HANDSHAKE_TERMSEQ_LEN);

                    handshaker->recv_len = NN_WS_HANDSHAKE_TERMSEQ_LEN - i;

                    /*  In the unlikely case the client would overflow what we
                        assumed was a sufficiently-large buffer to receive the
                        handshake, we fail the connection. */
                    if (handshaker->recv_len + handshaker->recv_pos >
                        sizeof (handshaker->response)) {
                        nn_timer_stop (&handshaker->timer);
                        handshaker->state =
                            NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                    }
                    else {
                        handshaker->retries++;
                        nn_usock_recv (handshaker->usock,
                            handshaker->response + handshaker->recv_pos,
                            handshaker->recv_len, NULL);
                    }
                    return;
                default:
                    nn_fsm_error ("Unexpected handshake result",
                        handshaker->state, src, type);
                }
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE_SENT state.                                                     */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_HANDSHAKE_SENT:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  As per RFC 6455 4.2.2, the handshake is now complete
                    and the connection is immediately ready for send/recv. */
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it and wait for ERROR event. */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&handshaker->timer);
                handshaker->state = NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_ERROR);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_WS_HANDSHAKE_SRC_USOCK:
            /*  Ignore. The only circumstance the client would send bytes is
                to notify the server it is closing the connection. Wait for the
                socket to eventually error. */
            return;

        case NN_WS_HANDSHAKE_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_ws_handshake_leave (handshaker, NN_WS_HANDSHAKE_OK);
                return;
            default:
                nn_fsm_bad_action (handshaker->state, src, type);
            }

        default:
            nn_fsm_bad_source (handshaker->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_WS_HANDSHAKE_STATE_DONE:
        nn_fsm_bad_source (handshaker->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (handshaker->state, src, type);
    }
}